

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Discoverer.cpp
# Opt level: O2

void __thiscall new_words_discover::Discoverer::print(Discoverer *this)

{
  pointer ppVar1;
  pointer ppVar2;
  char cVar3;
  ulong uVar4;
  long lVar5;
  wostream *pwVar6;
  ostream *poVar7;
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>
  *s;
  string *psVar8;
  vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  __normal_iterator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>_>
  __i;
  long lVar9;
  pointer ppVar10;
  vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
  sorted;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string out_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  wofstream output;
  
  std::
  vector<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>,std::allocator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>>>
  ::
  vector<std::__detail::_Node_iterator<std::pair<std::__cxx11::wstring_const,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>,false,true>,void>
            ((vector<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>,std::allocator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>>>
              *)&sorted,
             (_Node_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_false,_true>
              )(this->words_)._M_h._M_before_begin._M_nxt,
             (_Node_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_false,_true>
              )0x0,(allocator_type *)&output);
  ppVar2 = sorted.
           super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar1 = sorted.
           super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (sorted.
      super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      sorted.
      super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar9 = (long)sorted.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)sorted.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = lVar9 / 0xa0;
    lVar5 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>*,std::vector<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>,std::allocator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<new_words_discover::Discoverer::print()::__0>>
              (sorted.
               super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               sorted.
               super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar9 < 0xa01) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>*,std::vector<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>,std::allocator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<new_words_discover::Discoverer::print()::__0>>
                (ppVar1,ppVar2);
    }
    else {
      ppVar10 = ppVar1 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>*,std::vector<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>,std::allocator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<new_words_discover::Discoverer::print()::__0>>
                (ppVar1,ppVar10);
      for (; ppVar10 != ppVar2; ppVar10 = ppVar10 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>*,std::vector<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>,std::allocator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>>>>,__gnu_cxx::__ops::_Val_comp_iter<new_words_discover::Discoverer::print()::__0>>
                  (ppVar10);
      }
    }
  }
  psVar8 = &this->filename_;
  lVar5 = std::__cxx11::string::rfind((char)psVar8,0x2e);
  out_file._M_dataplus._M_p = (pointer)&out_file.field_2;
  out_file._M_string_length = 0;
  out_file.field_2._M_local_buf[0] = '\0';
  if (lVar5 == -1) {
    std::__cxx11::string::string((string *)&output,(string *)psVar8);
  }
  else {
    std::__cxx11::string::substr((ulong)&output,(ulong)psVar8);
  }
  std::__cxx11::string::operator=((string *)&out_file,(string *)&output);
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::append((char *)&out_file);
  std::wofstream::wofstream(&output,(string *)&out_file,_S_out);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    std::operator+(&local_240,"Failed to open ",&out_file);
    std::operator+(&local_280,&local_240,"!");
    poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&local_280);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::string::~string((string *)&local_280);
    this_00 = &local_240;
  }
  else {
    pwVar6 = std::operator<<((wostream *)&output,L"Total words: ");
    pwVar6 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar6);
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar6);
    for (; sorted.
           super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           sorted.
           super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
        sorted.
        super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             sorted.
             super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) {
      pwVar6 = std::operator<<((wostream *)&output,
                               (wstring *)
                               sorted.
                               super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
      pwVar6 = std::operator<<(pwVar6,L" ");
      pwVar6 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar6);
      std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar6);
    }
    std::operator+(&local_280,"The results are stored in ",&out_file);
    poVar7 = std::operator<<((ostream *)&std::cout,(string *)&local_280);
    std::endl<char,std::char_traits<char>>(poVar7);
    this_00 = &local_280;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::wofstream::~wofstream(&output);
  std::__cxx11::string::~string((string *)&out_file);
  std::
  vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
  ::~vector(&sorted);
  return;
}

Assistant:

void Discoverer::print()
{
    std::vector<std::pair<std::wstring, word_t>> sorted(words_.begin(), words_.end());
    std::sort(sorted.begin(), sorted.end(), [](auto &x, auto &y) {
        return std::get<frequency_t>(x.second) < std::get<frequency_t>(y.second);
    });

    // Generating output filename by input filename, remove suffix if any.
    auto dot = filename_.find_last_of('.');
    std::string out_file;
    out_file = (dot != std::string::npos ? filename_.substr(0, dot) : filename_);
    out_file += "_out.txt";
    std::wofstream output(out_file);
    if (!output.is_open()) {
        std::cerr << "Failed to open " + out_file + "!" << std::endl;
        return;
    }
    output << L"Total words: " << sorted.size() << std::endl;
    for (const auto &s : sorted) {
        output << s.first << L" " << std::get<frequency_t>(s.second) << std::endl;
    }
    std::cout << "The results are stored in " + out_file << std::endl;
}